

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_HashStringLiteral_Test::~ExprTest_HashStringLiteral_Test
          (ExprTest_HashStringLiteral_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_HashStringLiteral_Test((ExprTest_HashStringLiteral_Test *)0x14b768);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, HashStringLiteral) {
  // String literal can only occur as a function argument, so test
  // it as a part of a call expression.
  Expr args[] = {factory_.MakeStringLiteral("test")};
  mp::Function f = factory_.AddFunction("foo", 1, mp::func::SYMBOLIC);
  size_t hash = HashCombine<int>(0, expr::CALL);
  hash = HashCombine(hash, f.name());
  TestString ts = {"test"};
  hash = HashCombine(hash, ts);
  EXPECT_EQ(hash, ExprHash()(MakeCall(f, args)));
}